

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix44<double> * __thiscall
Imath_3_2::Matrix44<double>::scale<float>(Matrix44<double> *this,Vec3<float> *s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar6 = (double)s->x;
  dVar7 = this->x[0][1];
  dVar8 = this->x[0][2];
  dVar1 = this->x[0][3];
  dVar2 = this->x[1][0];
  dVar3 = this->x[1][1];
  dVar4 = this->x[1][2];
  dVar5 = this->x[1][3];
  this->x[0][0] = this->x[0][0] * dVar6;
  this->x[0][1] = dVar7 * dVar6;
  this->x[0][2] = dVar8 * dVar6;
  this->x[0][3] = dVar1 * dVar6;
  dVar7 = (double)s->y;
  this->x[1][0] = dVar2 * dVar7;
  this->x[1][1] = dVar3 * dVar7;
  this->x[1][2] = dVar7 * dVar4;
  this->x[1][3] = dVar7 * dVar5;
  dVar8 = (double)s->z;
  dVar7 = this->x[2][1];
  this->x[2][0] = this->x[2][0] * dVar8;
  this->x[2][1] = dVar7 * dVar8;
  dVar7 = this->x[2][3];
  this->x[2][2] = this->x[2][2] * dVar8;
  this->x[2][3] = dVar7 * dVar8;
  return this;
}

Assistant:

const Matrix44<T>&
                 Matrix44<T>::scale (const Vec3<S>& s) IMATH_NOEXCEPT
{
    x[0][0] *= s.x;
    x[0][1] *= s.x;
    x[0][2] *= s.x;
    x[0][3] *= s.x;

    x[1][0] *= s.y;
    x[1][1] *= s.y;
    x[1][2] *= s.y;
    x[1][3] *= s.y;

    x[2][0] *= s.z;
    x[2][1] *= s.z;
    x[2][2] *= s.z;
    x[2][3] *= s.z;

    return *this;
}